

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O0

lzma_ret lzma_index_stream_flags(lzma_index *i,lzma_stream_flags *stream_flags)

{
  lzma_ret ret_;
  index_stream *s;
  lzma_stream_flags *stream_flags_local;
  lzma_index *i_local;
  
  if ((i == (lzma_index *)0x0) || (stream_flags == (lzma_stream_flags *)0x0)) {
    i_local._4_4_ = LZMA_PROG_ERROR;
  }
  else {
    i_local._4_4_ = lzma_stream_flags_compare(stream_flags,stream_flags);
    if (i_local._4_4_ == LZMA_OK) {
      memcpy(&(i->streams).rightmost[2].left,stream_flags,0x38);
      i_local._4_4_ = LZMA_OK;
    }
  }
  return i_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_index_stream_flags(lzma_index *i, const lzma_stream_flags *stream_flags)
{
	index_stream *s;

	if (i == NULL || stream_flags == NULL)
		return LZMA_PROG_ERROR;

	// Validate the Stream Flags.
	return_if_error(lzma_stream_flags_compare(
			stream_flags, stream_flags));

	s = (index_stream *)(i->streams.rightmost);
	s->stream_flags = *stream_flags;

	return LZMA_OK;
}